

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O2

uint8_t try_clock(int clock,btbb_packet *pkt)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint16_t data;
  int iVar3;
  char local_58 [8];
  char header [18];
  char local_38 [3];
  char local_35 [5];
  char unwhitened [18];
  
  iVar3 = unfec13(pkt->symbols + 0x44,local_58,0x12);
  if (iVar3 == 0) {
    uVar1 = '\0';
  }
  else {
    unwhiten(local_58,local_38,clock,0x12,0,pkt);
    data = air_to_host16(local_38,10);
    uVar1 = air_to_host8(unwhitened + 2,8);
    uVar1 = uap_from_hec(data,uVar1);
    pkt->UAP = uVar1;
    uVar2 = air_to_host8(local_35,4);
    pkt->packet_type = uVar2;
  }
  return uVar1;
}

Assistant:

uint8_t try_clock(int clock, btbb_packet* pkt)
{
	/* skip 72 bit access code */
	char *stream = pkt->symbols + 68;
	/* 18 bit packet header */
	char header[18];
	char unwhitened[18];

	if (!unfec13(stream, header, 18))
		return 0;
	unwhiten(header, unwhitened, clock, 18, 0, pkt);
	uint16_t hdr_data = air_to_host16(unwhitened, 10);
	uint8_t hec = air_to_host8(&unwhitened[10], 8);
	pkt->UAP = uap_from_hec(hdr_data, hec);
	pkt->packet_type = air_to_host8(&unwhitened[3], 4);

	return pkt->UAP;
}